

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDComponentPtrPair __thiscall ON_SubDVertex::BoundaryEdgePair(ON_SubDVertex *this)

{
  bool bVar1;
  ON_SubDComponentPtr OVar2;
  ON_SubDComponentPtr OVar3;
  bool bVar4;
  ulong uVar5;
  ON_SubDEdge *this_00;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  ON_SubDComponentPtrPair OVar9;
  ON__UINT_PTR local_50;
  ON__UINT_PTR local_48;
  ON__UINT_PTR local_40;
  ON__UINT_PTR local_38;
  
  OVar2.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
  OVar3.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
  if ((this->m_edges != (ON_SubDEdgePtr *)0x0) &&
     (OVar2.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr,
     OVar3.m_ptr = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr, 1 < this->m_edge_count)) {
    local_50 = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
    local_48 = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
    bVar8 = this->m_edge_count != 0;
    if (bVar8) {
      uVar6 = 0;
      do {
        uVar5 = this->m_edges[uVar6].m_ptr;
        bVar1 = false;
        this_00 = (ON_SubDEdge *)(uVar5 & 0xfffffffffffffff8);
        if ((this_00 != (ON_SubDEdge *)0x0) &&
           (bVar4 = ON_SubDEdge::HasBoundaryEdgeTopology(this_00), bVar4)) {
          uVar7 = (uint)uVar5 & 1;
          if (this_00->m_vertex[uVar7] == this) {
LAB_005d5524:
            if (local_48 < 8 || (local_48 & 6) == 0) {
              if (uVar5 < 8) {
                local_48 = 0;
              }
              else {
                local_48 = uVar5 & 0xfffffffffffffff9 | 4;
              }
            }
            else {
              if (7 < local_50 && (local_50 & 6) != 0) goto LAB_005d557e;
              if (uVar5 < 8) {
                local_50 = 0;
              }
              else {
                local_50 = uVar5 & 0xfffffffffffffff9 | 4;
              }
            }
            bVar1 = false;
          }
          else {
            ON_SubDIncrementErrorCount();
            ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_subd.cpp"
                       ,0x16fd,"","m_edges[vei] has incorrect edge orientation flag.");
            if (this_00->m_vertex[uVar7 ^ 1] == this) {
              uVar5 = uVar5 & 0xfffffffffffffff9 ^ 1;
              goto LAB_005d5524;
            }
LAB_005d557e:
            local_38 = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
            local_40 = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
            bVar1 = true;
          }
        }
        if (bVar1) break;
        uVar6 = uVar6 + 1;
        bVar8 = uVar6 < this->m_edge_count;
      } while (bVar8);
    }
    OVar2.m_ptr = local_48;
    OVar3.m_ptr = local_50;
    if (bVar8) goto LAB_005d561a;
  }
  local_40 = OVar3.m_ptr;
  local_38 = OVar2.m_ptr;
  if (local_40 < 8 || (local_40 & 6) == 0) {
    local_38 = ON_SubDComponentPtrPair::Null.m_pair[0].m_ptr;
    local_40 = ON_SubDComponentPtrPair::Null.m_pair[1].m_ptr;
  }
LAB_005d561a:
  OVar9.m_pair[1].m_ptr = local_40;
  OVar9.m_pair[0].m_ptr = local_38;
  return (ON_SubDComponentPtrPair)OVar9.m_pair;
}

Assistant:

const ON_SubDComponentPtrPair ON_SubDVertex::BoundaryEdgePair() const
{
  ON_SubDComponentPtrPair epair = ON_SubDComponentPtrPair::Null;
  if (nullptr != m_edges && m_edge_count >= 2)
  {
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      ON_SubDEdgePtr eptr = m_edges[vei];
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr.m_ptr);
      if (nullptr == e)
        continue;
      if (false == e->HasBoundaryEdgeTopology())
        continue;
      const ON__UINT_PTR edir = ON_SUBD_EDGE_DIRECTION(eptr.m_ptr);
      if (this != e->m_vertex[edir])
      {
        // m_edges[vei] is corrupt ...
        ON_SUBD_ERROR("m_edges[vei] has incorrect edge orientation flag.");
        if (this == e->m_vertex[1 - edir])
          eptr = eptr.Reversed(); // we can still return the requested information.
        else
          return ON_SubDComponentPtrPair::Null;
      }
      if (epair.m_pair[0].IsNull())
        epair.m_pair[0] = ON_SubDComponentPtr::Create(eptr);
      else if (epair.m_pair[1].IsNull())
        epair.m_pair[1] = ON_SubDComponentPtr::Create(eptr);
      else
        return ON_SubDComponentPtrPair::Null; // 3 or more boundary edges
    }
  }
  return (epair.m_pair[1].IsNotNull()) ? epair : ON_SubDComponentPtrPair::Null;
}